

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O0

int coda_time_string_to_parts
              (char *format,char *str,int *year,int *month,int *day,int *hour,int *minute,
              int *second,int *musec)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  int local_4c;
  int local_48;
  int offset;
  int n;
  int literal;
  int *hour_local;
  int *day_local;
  int *month_local;
  int *year_local;
  char *str_local;
  char *format_local;
  
  bVar1 = false;
  local_48 = 0;
  if (format == (char *)0x0) {
    coda_set_error(-100,"format argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                   ,0x5bc);
    format_local._4_4_ = -1;
  }
  else if (str == (char *)0x0) {
    coda_set_error(-100,"str argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                   ,0x5c1);
    format_local._4_4_ = -1;
  }
  else if (((((year == (int *)0x0) || (month == (int *)0x0)) || (day == (int *)0x0)) ||
           ((hour == (int *)0x0 || (minute == (int *)0x0)))) ||
          ((second == (int *)0x0 || (musec == (int *)0x0)))) {
    coda_set_error(-100,"date/time argument(s) are NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                   ,0x5c7);
    format_local._4_4_ = -1;
  }
  else {
    while( true ) {
      bVar3 = false;
      if ((format[local_48] != '\0') && (bVar3 = true, !bVar1)) {
        bVar3 = format[local_48] != '|';
      }
      if (!bVar3) break;
      if (format[local_48] == '\'') {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      local_48 = local_48 + 1;
    }
    if (format[local_48] == '|') {
      local_4c = 0;
      while (iVar2 = string_to_parts(format + local_4c,str,year,month,day,hour,minute,second,musec),
            iVar2 != 0) {
        if (format[local_48] == '\0') {
          coda_set_error(-0x68,"date/time argument (%s) did not match any of the formats (%s)",str,
                         format);
          return -1;
        }
        local_4c = local_48 + 1;
        local_48 = local_4c;
        while( true ) {
          bVar3 = false;
          if ((format[local_48] != '\0') && (bVar3 = true, !bVar1)) {
            bVar3 = format[local_48] != '|';
          }
          if (!bVar3) break;
          if (format[local_48] == '\'') {
            bVar1 = (bool)(bVar1 ^ 1);
          }
          local_48 = local_48 + 1;
        }
      }
      format_local._4_4_ = 0;
    }
    else {
      format_local._4_4_ = string_to_parts(format,str,year,month,day,hour,minute,second,musec);
    }
  }
  return format_local._4_4_;
}

Assistant:

LIBCODA_API int coda_time_string_to_parts(const char *format, const char *str, int *year, int *month, int *day,
                                          int *hour, int *minute, int *second, int *musec)
{
    int literal = 0;
    int n = 0;

    if (format == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "format argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (str == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "str argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (year == NULL || month == NULL || day == NULL || hour == NULL || minute == NULL || second == NULL ||
        musec == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "date/time argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    while (format[n] != '\0' && (literal || format[n] != '|'))
    {
        if (format[n] == '\'')
        {
            literal = !literal;
        }
        n++;
    }
    if (format[n] == '|')
    {
        int offset = 0;

        /* try multiple formats */
        while (1)
        {
            if (string_to_parts(&format[offset], str, year, month, day, hour, minute, second, musec) == 0)
            {
                /* found a format that works */
                return 0;
            }
            if (format[n] == '\0')
            {
                /* the string matched none of the formats */
                coda_set_error(CODA_ERROR_INVALID_DATETIME,
                               "date/time argument (%s) did not match any of the formats (%s)", str, format);
                return -1;
            }
            n++;
            offset = n;
            while (format[n] != '\0' && (literal || format[n] != '|'))
            {
                if (format[n] == '\'')
                {
                    literal = !literal;
                }
                n++;
            }
        }
    }

    return string_to_parts(format, str, year, month, day, hour, minute, second, musec);
}